

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

int google::protobuf::compiler::cpp::anon_unknown_0::popcnt(uint32_t n)

{
  int result;
  
  result = 0;
  for (; n != 0; n = n >> 1) {
    result = result + (n & 1);
  }
  return result;
}

Assistant:

static int popcnt(uint32_t n) {
  int result = 0;
  while (n != 0) {
    result += (n & 1);
    n = n / 2;
  }
  return result;
}